

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_read_incomplete_error(sexp ctx,char *msg,sexp ir,sexp port)

{
  sexp psVar1;
  sexp res;
  sexp_gc_var_t local_20;
  
  local_20.var = &res;
  res = (sexp)&DAT_0000043e;
  local_20.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_20;
  res = sexp_read_error(ctx,msg,ir,port);
  if ((((ulong)res & 3) == 0) && (res->tag == 0x13)) {
    psVar1 = sexp_intern(ctx,"read-incomplete",-1);
    (res->value).type.name = psVar1;
  }
  (ctx->value).context.saves = local_20.next;
  return res;
}

Assistant:

sexp sexp_read_incomplete_error (sexp ctx, const char *msg, sexp ir, sexp port) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_read_error(ctx, msg, ir, port);
  if (sexp_exceptionp(res))
    sexp_exception_kind(res) = sexp_intern(ctx, "read-incomplete", -1);
  sexp_gc_release1(ctx);
  return res;
}